

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O2

void __thiscall myvk::DescriptorSet::~DescriptorSet(DescriptorSet *this)

{
  ~DescriptorSet(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DescriptorSet::~DescriptorSet() {
	if (m_descriptor_set)
		vkFreeDescriptorSets(m_descriptor_pool_ptr->GetDevicePtr()->GetHandle(), m_descriptor_pool_ptr->GetHandle(), 1,
		                     &m_descriptor_set);
}